

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  string *psVar1;
  MessageOptions *pMVar2;
  FileOptions *pFVar3;
  size_type sVar4;
  long lVar5;
  char *__dest;
  MessageOptions *pMVar6;
  FileOptions *pFVar7;
  pointer __dest_00;
  size_type __dnew;
  size_type local_60;
  string local_58;
  string *local_38;
  
  lVar5 = *(long *)(field + 0x60);
  if ((*(byte *)(lVar5 + 0x6c) & 0x10) != 0) {
    ValidateMapKey(this,field,proto);
    lVar5 = *(long *)(field + 0x60);
  }
  if ((*(char *)(lVar5 + 0x45) == '\x01') && (*(int *)(field + 0x2c) != 0xb)) {
    psVar1 = *(string **)(field + 8);
    local_60 = 0x3a;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
    local_58.field_2._M_allocated_capacity = local_60;
    builtin_strncpy(local_58._M_dataplus._M_p,
                    "[lazy = true] can only be specified for submessage fields.",0x3a);
    local_58._M_string_length = local_60;
    local_58._M_dataplus._M_p[local_60] = '\0';
    AddError(this,psVar1,&proto->super_Message,TYPE,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    lVar5 = *(long *)(field + 0x60);
  }
  if ((*(char *)(lVar5 + 0x44) == '\x01') &&
     ((*(int *)(field + 0x30) != 3 || (0xfffffffb < *(int *)(field + 0x2c) - 0xdU)))) {
    local_38 = *(string **)(field + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_60 = 0x44;
    __dest = (char *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
    sVar4 = local_60;
    local_58.field_2._M_allocated_capacity = local_60;
    local_58._M_dataplus._M_p = __dest;
    memcpy(__dest,"[packed = true] can only be specified for repeated primitive fields.",0x44);
    local_58._M_string_length = sVar4;
    __dest[sVar4] = '\0';
    AddError(this,local_38,&proto->super_Message,TYPE,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (((*(long *)(field + 0x38) != 0) &&
      (pMVar2 = *(MessageOptions **)(*(long *)(field + 0x38) + 0x20),
      pMVar6 = MessageOptions::default_instance(), pMVar2 != pMVar6)) &&
     (*(char *)(*(long *)(*(long *)(field + 0x38) + 0x20) + 0x58) == '\x01')) {
    if (field[0x34] == (FieldDescriptor)0x1) {
      if ((*(int *)(field + 0x30) == 1) && (*(int *)(field + 0x2c) == 0xb)) goto LAB_001d904e;
      psVar1 = *(string **)(field + 8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_60 = 0x34;
      local_58._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
      local_58.field_2._M_allocated_capacity = local_60;
      builtin_strncpy(local_58._M_dataplus._M_p,
                      "Extensions of MessageSets must be optional messages.",0x34);
      local_58._M_string_length = local_60;
      local_58._M_dataplus._M_p[local_60] = '\0';
      AddError(this,psVar1,&proto->super_Message,TYPE,&local_58);
    }
    else {
      psVar1 = *(string **)(field + 8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_60 = 0x30;
      local_58._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
      local_58.field_2._M_allocated_capacity = local_60;
      builtin_strncpy(local_58._M_dataplus._M_p,"MessageSets cannot have fields, only extensions.",
                      0x30);
      local_58._M_string_length = local_60;
      local_58._M_dataplus._M_p[local_60] = '\0';
      AddError(this,psVar1,&proto->super_Message,NAME,&local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001d904e:
  lVar5 = *(long *)(field + 0x20);
  if ((((lVar5 != 0) &&
       (pFVar3 = *(FileOptions **)(lVar5 + 0x88), pFVar7 = FileOptions::default_instance(),
       pFVar3 != pFVar7)) &&
      ((*(int *)(*(long *)(lVar5 + 0x88) + 0x50) == 3 && (*(long *)(field + 0x38) != 0)))) &&
     (((lVar5 = *(long *)(*(long *)(field + 0x38) + 0x10), lVar5 == 0 ||
       (pFVar3 = *(FileOptions **)(lVar5 + 0x88), pFVar7 = FileOptions::default_instance(),
       pFVar3 == pFVar7)) || (*(int *)(*(long *)(lVar5 + 0x88) + 0x50) != 3)))) {
    psVar1 = *(string **)(field + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_60 = 0xa5;
    __dest_00 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_60);
    sVar4 = local_60;
    local_58.field_2._M_allocated_capacity = local_60;
    local_58._M_dataplus._M_p = __dest_00;
    memcpy(__dest_00,
           "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
           ,0xa5);
    local_58._M_string_length = sVar4;
    __dest_00[sVar4] = '\0';
    AddError(this,psVar1,&proto->super_Message,EXTENDEE,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(FieldDescriptor* field,
    const FieldDescriptorProto& proto) {
  if (field->options().has_experimental_map_key()) {
    ValidateMapKey(field, proto);
  }

  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
      field->full_name(), proto,
      DescriptorPool::ErrorCollector::TYPE,
      "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != NULL &&
      &field->containing_type()->options() !=
      &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) &&
      field->containing_type_ != NULL &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

}